

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O2

bool duckdb::ValueOperations::GreaterThan(Value *left,Value *right)

{
  InternalException *this;
  bool bVar1;
  allocator local_39;
  string local_38;
  
  if ((left->is_null == false) && (right->is_null != true)) {
    bVar1 = TemplatedBooleanOperation<duckdb::GreaterThan>(left,right);
    return bVar1;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Comparison on NULL values",&local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool ValueOperations::GreaterThan(const Value &left, const Value &right) {
	if (left.IsNull() || right.IsNull()) {
		throw InternalException("Comparison on NULL values");
	}
	return TemplatedBooleanOperation<duckdb::GreaterThan>(left, right);
}